

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

http_status_code parse_status_code(sub_string *text)

{
  char cVar1;
  char cVar2;
  char cVar3;
  size_t sVar4;
  char *pcVar5;
  http_parsing_error *this;
  
  sVar4 = sub_string::size(text);
  if (sVar4 < 3) {
    this = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(this,"invalid status code");
  }
  else {
    pcVar5 = sub_string::operator[](text,0);
    if ((byte)(*pcVar5 - 0x30U) < 10) {
      pcVar5 = sub_string::operator[](text,1);
      if ((byte)(*pcVar5 - 0x30U) < 10) {
        pcVar5 = sub_string::operator[](text,2);
        if ((byte)(*pcVar5 - 0x30U) < 10) {
          pcVar5 = sub_string::operator[](text,0);
          cVar1 = *pcVar5;
          pcVar5 = sub_string::operator[](text,1);
          cVar2 = *pcVar5;
          pcVar5 = sub_string::operator[](text,2);
          cVar3 = *pcVar5;
          sub_string::advance(text,3);
          return ((int)cVar3 + cVar1 * 100 + cVar2 * 10) - 0x14d0;
        }
      }
    }
    this = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(this,"invalid status code");
  }
  __cxa_throw(this,&http_parsing_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

http_status_code parse_status_code(sub_string& text)
{
    if (text.size() < 3)
        throw http_parsing_error("invalid status code");

    if (!http_is_digit(text[0])
     || !http_is_digit(text[1])
     || !http_is_digit(text[2]))
        throw http_parsing_error("invalid status code");

    unsigned result = (text[0] - '0') * 100
                    + (text[1] - '0') * 10
                    + (text[2] - '0');

    text.advance(3);

    return static_cast<http_status_code>(result);
}